

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confidence.cc
# Opt level: O0

base_learner * confidence_setup(options_i *options,vw *all)

{
  typed_option<bool> *this;
  typed_option<bool> *op;
  ostream *this_00;
  pointer pcVar1;
  single_learner *dat;
  learner<confidence,_example> *this_01;
  vw *in_RSI;
  undefined8 *in_RDI;
  learner<confidence,_example> *l;
  _func_void_confidence_ptr_single_learner_ptr_example_ptr *predict_with_confidence_ptr;
  _func_void_confidence_ptr_single_learner_ptr_example_ptr *learn_with_confidence_ptr;
  free_ptr<confidence> data;
  option_group_definition new_options;
  bool confidence_after_training;
  bool confidence_arg;
  typed_option<bool> *in_stack_fffffffffffffba8;
  vw *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbb8;
  typed_option<bool> *in_stack_fffffffffffffbf8;
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [240];
  learner<char,_char> *in_stack_fffffffffffffd70;
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  typed_option<bool> local_1d0 [2];
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [62];
  undefined1 local_1a;
  byte local_19;
  vw *local_18;
  undefined8 *local_10;
  vw *local_8;
  
  local_19 = 0;
  local_1a = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Confidence",&local_79);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffbb0,
             (string *)in_stack_fffffffffffffba8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"confidence",&local_1f1);
  VW::config::make_option<bool>(in_stack_fffffffffffffbb8,(bool *)in_stack_fffffffffffffbb0);
  VW::config::typed_option<bool>::keep(local_1d0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"Get confidence for binary predictions",&local_219);
  this = VW::config::typed_option<bool>::help
                   ((typed_option<bool> *)in_stack_fffffffffffffbb0,
                    (string *)in_stack_fffffffffffffba8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  op = (typed_option<bool> *)
       VW::config::option_group_definition::add<bool>
                 ((option_group_definition *)this,in_stack_fffffffffffffbf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"confidence_after_training",&local_381);
  VW::config::make_option<bool>(in_stack_fffffffffffffbb8,(bool *)in_stack_fffffffffffffbb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"Confidence after training",&local_3a9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  VW::config::option_group_definition::add<bool>((option_group_definition *)this,op);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffbb0);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffbb0);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffbb0);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffbb0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  (**(code **)*local_10)(local_10,local_58);
  if ((local_19 & 1) == 0) {
    local_8 = (vw *)0x0;
  }
  else if ((local_18->training & 1U) == 0) {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "Confidence does not work in test mode because learning algorithm state is needed.  Use --save_resume when saving the model and avoid --test_only"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_8 = (vw *)0x0;
  }
  else {
    scoped_calloc_or_throw<confidence>();
    pcVar1 = std::unique_ptr<confidence,_void_(*)(void_*)>::operator->
                       ((unique_ptr<confidence,_void_(*)(void_*)> *)0x2b8ec8);
    pcVar1->all = local_18;
    setup_base((options_i *)in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    dat = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffd70);
    this_01 = LEARNER::init_learner<confidence,example,LEARNER::learner<char,example>>
                        ((free_ptr<confidence> *)dat,
                         (learner<char,_example> *)in_stack_fffffffffffffbb8,
                         (_func_void_confidence_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffbb0,
                         (_func_void_confidence_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffba8);
    LEARNER::learner<confidence,_example>::set_finish_example(this_01,return_confidence_example);
    in_stack_fffffffffffffbb0 = (vw *)LEARNER::make_base<confidence,example>(this_01);
    local_8 = in_stack_fffffffffffffbb0;
    std::unique_ptr<confidence,_void_(*)(void_*)>::~unique_ptr
              ((unique_ptr<confidence,_void_(*)(void_*)> *)dat);
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffbb0);
  return (base_learner *)local_8;
}

Assistant:

base_learner* confidence_setup(options_i& options, vw& all)
{
  bool confidence_arg = false;
  bool confidence_after_training = false;
  option_group_definition new_options("Confidence");
  new_options.add(make_option("confidence", confidence_arg).keep().help("Get confidence for binary predictions"))
      .add(make_option("confidence_after_training", confidence_after_training).help("Confidence after training"));
  options.add_and_parse(new_options);

  if (!confidence_arg)
    return nullptr;

  if (!all.training)
  {
    cout << "Confidence does not work in test mode because learning algorithm state is needed.  Use --save_resume when "
            "saving the model and avoid --test_only"
         << endl;
    return nullptr;
  }

  auto data = scoped_calloc_or_throw<confidence>();
  data->all = &all;

  void (*learn_with_confidence_ptr)(confidence&, single_learner&, example&) = nullptr;
  void (*predict_with_confidence_ptr)(confidence&, single_learner&, example&) = nullptr;

  if (confidence_after_training)
  {
    learn_with_confidence_ptr = predict_or_learn_with_confidence<true, true>;
    predict_with_confidence_ptr = predict_or_learn_with_confidence<false, true>;
  }
  else
  {
    learn_with_confidence_ptr = predict_or_learn_with_confidence<true, false>;
    predict_with_confidence_ptr = predict_or_learn_with_confidence<false, false>;
  }

  // Create new learner
  learner<confidence, example>& l = init_learner(
      data, as_singleline(setup_base(options, all)), learn_with_confidence_ptr, predict_with_confidence_ptr);

  l.set_finish_example(return_confidence_example);

  return make_base(l);
}